

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

value_type __thiscall djb::sgd::g1(sgd *this,vec3 *wi)

{
  double dVar1;
  double __y;
  long lVar2;
  long in_RDX;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  value_type vVar8;
  
  (**(code **)(*(long *)wi + 0x10))();
  pfVar3 = extraout_RDX;
  if (0 < *(int *)&(this->super_brdf_rgb).super_brdf._vptr_brdf) {
    lVar4 = 0;
    do {
      lVar2 = *(long *)&wi[1].y;
      dVar6 = *(double *)(lVar2 + 0x100 + lVar4 * 8);
      dVar7 = *(double *)(lVar2 + 0xb8 + lVar4 * 8);
      dVar1 = *(double *)(lVar2 + 0xd0 + lVar4 * 8);
      __y = *(double *)(lVar2 + 0xe8 + lVar4 * 8);
      dVar5 = acos((double)*(float *)(in_RDX + 8));
      dVar5 = dVar5 - dVar6;
      dVar6 = 0.0;
      if (0.0 <= dVar5) {
        dVar6 = dVar5;
      }
      dVar6 = pow(dVar6,__y);
      dVar6 = exp(dVar6 * dVar1);
      dVar7 = (1.0 - dVar6) * dVar7 + 1.0;
      dVar6 = 0.0;
      if (0.0 <= dVar7) {
        dVar6 = dVar7;
      }
      dVar7 = 1.0;
      if (dVar6 <= 1.0) {
        dVar7 = dVar6;
      }
      *(float *)((long)&((this->m_fresnel).m_f)->_vptr_impl + lVar4 * 4) = (float)dVar7;
      lVar4 = lVar4 + 1;
      pfVar3 = extraout_RDX_00;
    } while (lVar4 < *(int *)&(this->super_brdf_rgb).super_brdf._vptr_brdf);
  }
  vVar8._M_data = pfVar3;
  vVar8._M_size = (size_t)this;
  return vVar8;
}

Assistant:

brdf::value_type sgd::g1(const vec3 &wi) const
{
	brdf::value_type g1 = zero_value();

	for (int i = 0; i < (int)g1.size(); ++i)
		g1[i] = sgd__g1(wi, m_data->theta0[i], m_data->c[i],
	                    m_data->k[i], m_data->lambda[i]);

	return g1;
}